

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O1

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * GetBitcoinUtxoList(void)

{
  uint8_t *puVar1;
  iterator iVar2;
  vector<cfd::Utxo,std::allocator<cfd::Utxo>> *in_RDI;
  Txid txid;
  Utxo utxo;
  Txid local_150;
  ByteData local_130;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  Utxo local_100;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  puVar1 = local_100.block_hash + 8;
  local_100.block_height = (uint64_t)puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a"
             ,"");
  cfd::core::Txid::Txid(&local_150,(string *)&local_100);
  if ((uint8_t *)local_100.block_height != puVar1) {
    operator_delete((void *)local_100.block_height);
  }
  memset(&local_100,0,0xd8);
  cfd::core::Txid::GetData(&local_130,&local_150);
  cfd::core::ByteData::GetBytes(&local_118,&local_130);
  local_100.txid._0_8_ =
       *(undefined8 *)
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_100.txid._8_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 8);
  local_100.txid._16_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x10);
  local_100.txid._24_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x18);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_100.vout = 0;
  local_100.amount = (uint64_t)&DAT_12a05f20;
  local_100.witness_size_max = 0x6a;
  local_100.uscript_size_max = 0x16;
  iVar2._M_current = *(Utxo **)(in_RDI + 8);
  if (iVar2._M_current == *(Utxo **)(in_RDI + 0x10)) {
    std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
              (in_RDI,iVar2,&local_100);
  }
  else {
    memcpy(iVar2._M_current,&local_100,0xd8);
    *(Utxo **)(in_RDI + 8) = iVar2._M_current + 1;
  }
  local_150._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_100.block_height = (uint64_t)puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a"
             ,"");
  cfd::core::Txid::Txid(&local_150,(string *)&local_100);
  if ((uint8_t *)local_100.block_height != puVar1) {
    operator_delete((void *)local_100.block_height);
  }
  memset(&local_100,0,0xd8);
  cfd::core::Txid::GetData(&local_130,&local_150);
  cfd::core::ByteData::GetBytes(&local_118,&local_130);
  local_100.txid._0_8_ =
       *(undefined8 *)
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_100.txid._8_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 8);
  local_100.txid._16_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x10);
  local_100.txid._24_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x18);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_100.vout = 0;
  local_100.amount = (uint64_t)&DAT_04a817c8;
  local_100.witness_size_max = 0x6a;
  local_100.uscript_size_max = 0x16;
  iVar2._M_current = *(Utxo **)(in_RDI + 8);
  if (iVar2._M_current == *(Utxo **)(in_RDI + 0x10)) {
    std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
              (in_RDI,iVar2,&local_100);
  }
  else {
    memcpy(iVar2._M_current,&local_100,0xd8);
    *(Utxo **)(in_RDI + 8) = iVar2._M_current + 1;
  }
  local_150._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_100.block_height = (uint64_t)puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a"
             ,"");
  cfd::core::Txid::Txid(&local_150,(string *)&local_100);
  if ((uint8_t *)local_100.block_height != puVar1) {
    operator_delete((void *)local_100.block_height);
  }
  memset(&local_100,0,0xd8);
  cfd::core::Txid::GetData(&local_130,&local_150);
  cfd::core::ByteData::GetBytes(&local_118,&local_130);
  local_100.txid._0_8_ =
       *(undefined8 *)
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_100.txid._8_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 8);
  local_100.txid._16_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x10);
  local_100.txid._24_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x18);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_100.vout = 0;
  local_100.amount = (uint64_t)&DAT_4a817c80;
  local_100.witness_size_max = 0x6a;
  local_100.uscript_size_max = 0x16;
  iVar2._M_current = *(Utxo **)(in_RDI + 8);
  if (iVar2._M_current == *(Utxo **)(in_RDI + 0x10)) {
    std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
              (in_RDI,iVar2,&local_100);
  }
  else {
    memcpy(iVar2._M_current,&local_100,0xd8);
    *(Utxo **)(in_RDI + 8) = iVar2._M_current + 1;
  }
  local_150._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_100.block_height = (uint64_t)puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a"
             ,"");
  cfd::core::Txid::Txid(&local_150,(string *)&local_100);
  if ((uint8_t *)local_100.block_height != puVar1) {
    operator_delete((void *)local_100.block_height);
  }
  memset(&local_100,0,0xd8);
  cfd::core::Txid::GetData(&local_130,&local_150);
  cfd::core::ByteData::GetBytes(&local_118,&local_130);
  local_100.txid._0_8_ =
       *(undefined8 *)
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_100.txid._8_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 8);
  local_100.txid._16_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x10);
  local_100.txid._24_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x18);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_100.vout = 0;
  local_100.amount = (uint64_t)&DAT_02540be4;
  local_100.witness_size_max = 0x6a;
  local_100.uscript_size_max = 0x16;
  iVar2._M_current = *(Utxo **)(in_RDI + 8);
  if (iVar2._M_current == *(Utxo **)(in_RDI + 0x10)) {
    std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
              (in_RDI,iVar2,&local_100);
  }
  else {
    memcpy(iVar2._M_current,&local_100,0xd8);
    *(Utxo **)(in_RDI + 8) = iVar2._M_current + 1;
  }
  local_150._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_100.block_height = (uint64_t)puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a"
             ,"");
  cfd::core::Txid::Txid(&local_150,(string *)&local_100);
  if ((uint8_t *)local_100.block_height != puVar1) {
    operator_delete((void *)local_100.block_height);
  }
  memset(&local_100,0,0xd8);
  cfd::core::Txid::GetData(&local_130,&local_150);
  cfd::core::ByteData::GetBytes(&local_118,&local_130);
  local_100.txid._0_8_ =
       *(undefined8 *)
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_100.txid._8_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 8);
  local_100.txid._16_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x10);
  local_100.txid._24_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x18);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_100.vout = 0;
  local_100.amount = (uint64_t)&DAT_09502f90;
  local_100.witness_size_max = 0x6a;
  local_100.uscript_size_max = 0x16;
  iVar2._M_current = *(Utxo **)(in_RDI + 8);
  if (iVar2._M_current == *(Utxo **)(in_RDI + 0x10)) {
    std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
              (in_RDI,iVar2,&local_100);
  }
  else {
    memcpy(iVar2._M_current,&local_100,0xd8);
    *(Utxo **)(in_RDI + 8) = iVar2._M_current + 1;
  }
  local_150._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_100.block_height = (uint64_t)puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b"
             ,"");
  cfd::core::Txid::Txid(&local_150,(string *)&local_100);
  if ((uint8_t *)local_100.block_height != puVar1) {
    operator_delete((void *)local_100.block_height);
  }
  memset(&local_100,0,0xd8);
  cfd::core::Txid::GetData(&local_130,&local_150);
  cfd::core::ByteData::GetBytes(&local_118,&local_130);
  local_100.txid._0_8_ =
       *(undefined8 *)
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_100.txid._8_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 8);
  local_100.txid._16_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x10);
  local_100.txid._24_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x18);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_100.vout = 0;
  local_100.amount = 2500000000;
  local_100.witness_size_max = 0x6a;
  local_100.uscript_size_max = 0x16;
  iVar2._M_current = *(Utxo **)(in_RDI + 8);
  if (iVar2._M_current == *(Utxo **)(in_RDI + 0x10)) {
    std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
              (in_RDI,iVar2,&local_100);
  }
  else {
    memcpy(iVar2._M_current,&local_100,0xd8);
    *(Utxo **)(in_RDI + 8) = iVar2._M_current + 1;
  }
  local_150._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_100.block_height = (uint64_t)puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"0f093988839178ea5895431241cb4400fb31dd7b665a1a93cbd372336c717e0c"
             ,"");
  cfd::core::Txid::Txid(&local_150,(string *)&local_100);
  if ((uint8_t *)local_100.block_height != puVar1) {
    operator_delete((void *)local_100.block_height);
  }
  memset(&local_100,0,0xd8);
  cfd::core::Txid::GetData(&local_130,&local_150);
  cfd::core::ByteData::GetBytes(&local_118,&local_130);
  local_100.txid._0_8_ =
       *(undefined8 *)
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_100.txid._8_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 8);
  local_100.txid._16_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x10);
  local_100.txid._24_8_ =
       *(undefined8 *)
        (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x18);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_100.vout = 0;
  local_100.amount = 5000000000;
  local_100.witness_size_max = 0x6a;
  local_100.uscript_size_max = 0x16;
  iVar2._M_current = *(Utxo **)(in_RDI + 8);
  if (iVar2._M_current == *(Utxo **)(in_RDI + 0x10)) {
    std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
              (in_RDI,iVar2,&local_100);
  }
  else {
    memcpy(iVar2._M_current,&local_100,0xd8);
    *(Utxo **)(in_RDI + 8) = iVar2._M_current + 1;
  }
  local_150._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_RDI;
}

Assistant:

static std::vector<Utxo> GetBitcoinUtxoList() {
  // std::string desc = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
  constexpr uint16_t witness_size = 106; // 71 + 33 + 2
  constexpr uint16_t scriptsig_size = 22; // 20 + 2

  std::vector<Utxo> utxos;
  {
    Txid txid("7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 312500000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 78125000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 1250000000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 39062500;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 156250000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 2500000000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("0f093988839178ea5895431241cb4400fb31dd7b665a1a93cbd372336c717e0c");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 5000000000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  return utxos;
}